

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

Fl_Tree_Item * __thiscall Fl_Tree::first_visible_item(Fl_Tree *this)

{
  int iVar1;
  Fl_Tree_Item *item;
  Fl_Tree_Item *local_30;
  Fl_Tree_Item *local_20;
  Fl_Tree_Item *i;
  Fl_Tree *this_local;
  
  iVar1 = showroot(this);
  if (iVar1 == 0) {
    item = first(this);
    local_30 = next(this,item);
  }
  else {
    local_30 = first(this);
  }
  local_20 = local_30;
  while( true ) {
    if (local_20 == (Fl_Tree_Item *)0x0) {
      return (Fl_Tree_Item *)0x0;
    }
    iVar1 = Fl_Tree_Item::visible(local_20);
    if (iVar1 != 0) break;
    local_20 = next(this,local_20);
  }
  return local_20;
}

Assistant:

Fl_Tree_Item* Fl_Tree::first_visible_item() {
  Fl_Tree_Item *i = showroot() ? first() : next(first());
  while ( i ) {
    if ( i->visible() ) return(i);
    i = next(i);
  }
  return(0);
}